

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corr.cpp
# Opt level: O3

AggregateFunction * duckdb::CorrFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType local_50;
  LogicalType local_38;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffe0,DOUBLE);
  LogicalType::LogicalType(&local_38,DOUBLE);
  LogicalType::LogicalType(&local_50,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::CorrState,double,double,double,duckdb::CorrOperation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffe0,&local_38,&local_50,in_R8);
  LogicalType::~LogicalType(&local_50);
  LogicalType::~LogicalType(&local_38);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffe0);
  return in_RDI;
}

Assistant:

AggregateFunction CorrFun::GetFunction() {
	return AggregateFunction::BinaryAggregate<CorrState, double, double, double, CorrOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}